

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O2

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  _xmlCatalogEntry *p_Var7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  _xmlCatalogEntry *local_1f0;
  uint local_1dc;
  xmlCatalogEntryPtr local_1d0;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar2 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar2 == 0) {
      pxVar4 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs != 0) {
        if (pxVar4 == (xmlChar *)0x0) {
          pcVar1 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar1 = "Public URN ID expanded to %s\n";
          URI = pxVar4;
        }
        xmlCatalogPrintDebug(pcVar1 + 7,URI);
      }
      pxVar5 = xmlCatalogListXMLResolve(catal,pxVar4,(xmlChar *)0x0);
      if (pxVar4 == (xmlChar *)0x0) {
        return pxVar5;
      }
      (*xmlFree)(pxVar4);
      return pxVar5;
    }
    for (; catal != (xmlCatalogEntryPtr)0x0; catal = catal->next) {
      if (catal->type == XML_CATA_CATALOG) {
        local_1f0 = catal->children;
        if (local_1f0 == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
          local_1f0 = catal->children;
          if (local_1f0 == (_xmlCatalogEntry *)0x0) goto LAB_0015c5fe;
        }
        if (local_1f0->depth < 0x33) {
          iVar2 = 0;
          iVar10 = 0;
          local_1d0 = (xmlCatalogEntryPtr)0x0;
          local_1dc = 0;
          for (p_Var7 = local_1f0; p_Var7 != (xmlCatalogEntryPtr)0x0; p_Var7 = p_Var7->next) {
            switch(p_Var7->type) {
            case XML_CATA_NEXT_CATALOG:
              iVar10 = iVar10 + 1;
              break;
            case XML_CATA_URI:
              iVar3 = xmlStrEqual(URI,p_Var7->name);
              if (iVar3 != 0) {
                if (xmlDebugCatalogs != 0) {
                  xmlCatalogPrintDebug("Found URI match %s\n");
                }
                pxVar4 = xmlStrdup(p_Var7->URL);
                goto LAB_0015c5f9;
              }
              break;
            case XML_CATA_REWRITE_URI:
              uVar11 = xmlStrlen(p_Var7->name);
              if (((int)local_1dc < (int)uVar11) &&
                 (iVar3 = xmlStrncmp(URI,p_Var7->name,uVar11), iVar3 == 0)) {
                local_1dc = uVar11;
                local_1d0 = p_Var7;
              }
              break;
            case XML_CATA_DELEGATE_URI:
              pxVar4 = p_Var7->name;
              iVar3 = xmlStrlen(pxVar4);
              iVar3 = xmlStrncmp(URI,pxVar4,iVar3);
              iVar2 = iVar2 + (uint)(iVar3 == 0);
            }
          }
          if (local_1d0 == (xmlCatalogEntryPtr)0x0) {
            if (iVar2 != 0) {
              uVar11 = 0;
              do {
                uVar9 = 0;
                if (0 < (int)uVar11) {
                  uVar9 = (ulong)uVar11;
                }
                while( true ) {
                  if (local_1f0 == (xmlCatalogEntryPtr)0x0) {
                    return (xmlChar *)0xffffffffffffffff;
                  }
                  if ((local_1f0->type != XML_CATA_DELEGATE_URI) &&
                     (local_1f0->type != XML_CATA_DELEGATE_SYSTEM)) break;
                  pxVar4 = local_1f0->name;
                  iVar2 = xmlStrlen(pxVar4);
                  iVar2 = xmlStrncmp(URI,pxVar4,iVar2);
                  if (iVar2 != 0) break;
                  uVar8 = 0;
                  do {
                    if (uVar9 == uVar8) {
                      if ((int)uVar11 < 0x32) {
                        lVar6 = (long)(int)uVar11;
                        uVar11 = uVar11 + 1;
                        auStack_1c8[lVar6] = local_1f0->URL;
                      }
                      p_Var7 = local_1f0->children;
                      if (p_Var7 == (_xmlCatalogEntry *)0x0) {
                        xmlFetchXMLCatalogFile(local_1f0);
                        p_Var7 = local_1f0->children;
                        if (p_Var7 == (_xmlCatalogEntry *)0x0) goto LAB_0015c778;
                      }
                      if (xmlDebugCatalogs != 0) {
                        xmlCatalogPrintDebug("Trying URI delegate %s\n",local_1f0->URL);
                        p_Var7 = local_1f0->children;
                      }
                      pxVar4 = xmlCatalogListXMLResolveURI(p_Var7,URI);
                      if (pxVar4 != (xmlChar *)0x0) {
                        return pxVar4;
                      }
                      goto LAB_0015c778;
                    }
                    iVar2 = xmlStrEqual(local_1f0->URL,(xmlChar *)auStack_1c8[uVar8]);
                    uVar8 = uVar8 + 1;
                  } while (iVar2 == 0);
                  local_1f0 = local_1f0->next;
                }
LAB_0015c778:
                local_1f0 = local_1f0->next;
              } while( true );
            }
            if (iVar10 != 0) {
              for (; local_1f0 != (xmlCatalogEntryPtr)0x0; local_1f0 = local_1f0->next) {
                if (local_1f0->type == XML_CATA_NEXT_CATALOG) {
                  p_Var7 = local_1f0->children;
                  if (p_Var7 == (_xmlCatalogEntry *)0x0) {
                    xmlFetchXMLCatalogFile(local_1f0);
                    p_Var7 = local_1f0->children;
                    if (p_Var7 == (_xmlCatalogEntry *)0x0) goto LAB_0015c5c8;
                  }
                  pxVar4 = xmlCatalogListXMLResolveURI(p_Var7,URI);
                  if (pxVar4 != (xmlChar *)0x0) {
                    return pxVar4;
                  }
                }
LAB_0015c5c8:
              }
            }
          }
          else {
            if (xmlDebugCatalogs != 0) {
              xmlCatalogPrintDebug("Using rewriting rule %s\n");
            }
            pxVar4 = xmlStrdup(local_1d0->URL);
            if (pxVar4 != (xmlChar *)0x0) {
              pxVar4 = xmlStrcat(pxVar4,URI + local_1dc);
LAB_0015c5f9:
              if (pxVar4 != (xmlChar *)0x0) {
                return pxVar4;
              }
            }
          }
        }
        else {
          xmlCatalogErr(local_1f0,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                        local_1f0->name,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
LAB_0015c5fe:
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlCatalogPrintDebug(
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}